

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall
QFileDialogTreeView::setFileDialogPrivate(QFileDialogTreeView *this,QFileDialogPrivate *d_pointer)

{
  QHeaderView *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QTreeView *unaff_retaddr;
  SelectionBehavior in_stack_ffffffffffffffcc;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar2;
  QWidget *pQVar3;
  DragDropMode behavior;
  QHeaderView *in_stack_fffffffffffffff0;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  *(QHeaderView **)(in_RDI + 1) = in_RSI;
  uVar1 = 1;
  pQVar3 = in_RDI;
  QAbstractItemView::setSelectionBehavior
            ((QAbstractItemView *)CONCAT44(in_stack_ffffffffffffffd4,1),in_stack_ffffffffffffffcc);
  uVar2 = 0;
  QTreeView::setRootIsDecorated
            ((QTreeView *)(ulong)uVar1,SUB41(in_stack_ffffffffffffffcc >> 0x18,0));
  QTreeView::setItemsExpandable
            ((QTreeView *)CONCAT44(uVar2,uVar1),SUB41(in_stack_ffffffffffffffcc >> 0x18,0));
  QTreeView::setSortingEnabled(unaff_retaddr,SUB81((ulong)lVar4 >> 0x38,0));
  QTreeView::header((QTreeView *)CONCAT44(uVar2,uVar1));
  QHeaderView::setSortIndicator
            (in_stack_fffffffffffffff0,(int)((ulong)pQVar3 >> 0x20),(SortOrder)pQVar3);
  behavior = (DragDropMode)((ulong)pQVar3 >> 0x20);
  QTreeView::header((QTreeView *)CONCAT44(uVar2,uVar1));
  QHeaderView::setStretchLastSection(in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  QAbstractItemView::setTextElideMode
            ((QAbstractItemView *)CONCAT44(uVar2,uVar1),in_stack_ffffffffffffffcc);
  QFlags<QAbstractItemView::EditTrigger>::QFlags
            ((QFlags<QAbstractItemView::EditTrigger> *)CONCAT44(uVar2,uVar1),
             in_stack_ffffffffffffffcc);
  QAbstractItemView::setEditTriggers
            ((QAbstractItemView *)CONCAT44(uVar2,uVar1),
             (QFlagsStorageHelper<QAbstractItemView::EditTrigger,_4>)SUB84((ulong)in_RDI >> 0x20,0))
  ;
  QWidget::setContextMenuPolicy(in_RDI,CustomContextMenu);
  QAbstractItemView::setDragDropMode(&in_stack_fffffffffffffff0->super_QAbstractItemView,behavior);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogTreeView::setFileDialogPrivate(QFileDialogPrivate *d_pointer)
{
    d_ptr = d_pointer;
    setSelectionBehavior(QAbstractItemView::SelectRows);
    setRootIsDecorated(false);
    setItemsExpandable(false);
    setSortingEnabled(true);
    header()->setSortIndicator(0, Qt::AscendingOrder);
    header()->setStretchLastSection(false);
    setTextElideMode(Qt::ElideMiddle);
    setEditTriggers(QAbstractItemView::EditKeyPressed);
    setContextMenuPolicy(Qt::CustomContextMenu);
#if QT_CONFIG(draganddrop)
    setDragDropMode(QAbstractItemView::InternalMove);
#endif
}